

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

subsector_t * R_PointInSubsector(fixed_t x,fixed_t y)

{
  node_t *pnVar1;
  long lVar2;
  
  if ((long)numnodes != 0) {
    pnVar1 = nodes + (long)numnodes + -1;
    do {
      lVar2 = (long)pnVar1->dy * ((long)pnVar1->x - (long)x) +
              (long)pnVar1->dx * ((long)y - (long)pnVar1->y);
      pnVar1 = *(node_t **)
                ((long)&pnVar1->field_6 +
                (ulong)((int)((ulong)lVar2 >> 0x20) != 0 && -1 < lVar2) * 8);
    } while (((ulong)pnVar1 & 1) == 0);
    return (subsector_t *)((long)&pnVar1[-1].field_6 + 0xf);
  }
  return subsectors;
}

Assistant:

subsector_t *R_PointInSubsector (fixed_t x, fixed_t y)
{
	node_t *node;
	int side;

	// single subsector is a special case
	if (numnodes == 0)
		return subsectors;
				
	node = nodes + numnodes - 1;

	do
	{
		side = R_PointOnSide (x, y, node);
		node = (node_t *)node->children[side];
	}
	while (!((size_t)node & 1));
		
	return (subsector_t *)((BYTE *)node - 1);
}